

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scc.cpp
# Opt level: O2

void __thiscall SCCTest_BigDiamond_Test::TestBody(SCCTest_BigDiamond_Test *this)

{
  long lVar1;
  char *message;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<unsigned_int> __l_02;
  initializer_list<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>
  __l_03;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_198;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> local_168;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> local_138;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> local_108;
  _Rb_tree<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::_Identity<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  local_d8;
  uint local_a8 [2];
  undefined1 *local_a0;
  uint local_98 [4];
  _Rb_tree<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::_Identity<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  local_88;
  internal local_58 [8];
  AssertionResult gtest_ar;
  Graph_conflict1 graph;
  less<unsigned_int> local_28;
  allocator_type local_27;
  less<unsigned_int> local_26;
  allocator_type local_25;
  less<unsigned_int> local_24;
  allocator_type local_23;
  less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_> local_22;
  allocator_type local_21;
  
  Graph::Graph((Graph *)&gtest_ar.message_,8);
  Graph::addEdge((Graph *)&gtest_ar.message_,0,1);
  Graph::addEdge((Graph *)&gtest_ar.message_,1,0);
  Graph::addEdge((Graph *)&gtest_ar.message_,2,3);
  Graph::addEdge((Graph *)&gtest_ar.message_,3,2);
  Graph::addEdge((Graph *)&gtest_ar.message_,4,5);
  Graph::addEdge((Graph *)&gtest_ar.message_,5,4);
  Graph::addEdge((Graph *)&gtest_ar.message_,6,7);
  Graph::addEdge((Graph *)&gtest_ar.message_,7,6);
  Graph::addEdge((Graph *)&gtest_ar.message_,2,0);
  Graph::addEdge((Graph *)&gtest_ar.message_,2,4);
  Graph::addEdge((Graph *)&gtest_ar.message_,0,6);
  Graph::addEdge((Graph *)&gtest_ar.message_,4,6);
  getSCCs((SCCSet *)&local_88,(Graph_conflict1 *)&gtest_ar.message_);
  local_a8[0] = 0;
  local_a8[1] = 1;
  __l._M_len = 2;
  __l._M_array = local_a8;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&local_198
             ,__l,(less<unsigned_int> *)
                  ((long)&graph.graph.
                          super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 6),
             (allocator_type *)
             ((long)&graph.graph.
                     super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_a0 = &DAT_300000002;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_a0;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            (&local_168,__l_00,&local_28,&local_27);
  local_98[0] = 4;
  local_98[1] = 5;
  __l_01._M_len = 2;
  __l_01._M_array = local_98;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            (&local_138,__l_01,&local_26,&local_25);
  local_98[2] = 6;
  local_98[3] = 7;
  __l_02._M_len = 2;
  __l_02._M_array = local_98 + 2;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            (&local_108,__l_02,&local_24,&local_23);
  __l_03._M_len = 4;
  __l_03._M_array = (iterator)&local_198;
  std::
  set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::set((set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
         *)&local_d8,__l_03,&local_22,&local_21);
  testing::internal::
  CmpHelperEQ<std::set<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>,std::less<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>,std::allocator<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>>,std::set<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>,std::less<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>,std::allocator<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>>>
            (local_58,"getSCCs(graph)","(SCCSet{{0, 1}, {2, 3}, {4, 5}, {6, 7}})",
             (set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              *)&local_88,
             (set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              *)&local_d8);
  std::
  _Rb_tree<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::_Identity<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~_Rb_tree(&local_d8);
  lVar1 = 0x90;
  do {
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)(&local_198._M_impl.field_0x0 + lVar1));
    lVar1 = lVar1 + -0x30;
  } while (lVar1 != -0x30);
  std::
  _Rb_tree<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::_Identity<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~_Rb_tree(&local_88);
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_198);
    if (gtest_ar._0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/scc.cpp"
               ,0x136,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)&local_198);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if ((long *)local_198._M_impl._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_198._M_impl._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
  std::
  vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(SCCTest, BigDiamond) {
  // 67 <- 01 <- 23 -> 45 -> 67
  Graph graph(8);
  graph.addEdge(0, 1);
  graph.addEdge(1, 0);

  graph.addEdge(2, 3);
  graph.addEdge(3, 2);

  graph.addEdge(4, 5);
  graph.addEdge(5, 4);

  graph.addEdge(6, 7);
  graph.addEdge(7, 6);

  graph.addEdge(2, 0);
  graph.addEdge(2, 4);
  graph.addEdge(0, 6);
  graph.addEdge(4, 6);

  EXPECT_EQ(getSCCs(graph), (SCCSet{{0, 1}, {2, 3}, {4, 5}, {6, 7}}));
}